

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall
slang::parsing::Lexer::scanEncodedText
          (Lexer *this,ProtectEncoding encoding,uint32_t expectedBytes,bool singleLine,
          bool legacyProtectedMode)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  Diagnostic *pDVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  uint arg;
  bool singleLine_local;
  bool legacyProtectedMode_local;
  undefined8 local_70;
  uint local_64;
  anon_class_24_3_ac0d555d invalidByte;
  anon_class_16_2_98147aed lookingAtPragma;
  
  local_70 = CONCAT44(in_register_00000014,expectedBytes);
  invalidByte.singleLine = &singleLine_local;
  lookingAtPragma.legacyProtectedMode = &legacyProtectedMode_local;
  invalidByte.lookingAtPragma = &lookingAtPragma;
  local_64 = (uint)(encoding == QuotedPrintable);
  arg = 0;
  singleLine_local = singleLine;
  legacyProtectedMode_local = legacyProtectedMode;
  invalidByte.this = this;
  lookingAtPragma.this = this;
  while ((arg <= expectedBytes - 1 || (singleLine_local != false))) {
    pcVar5 = this->sourceBuffer;
    cVar1 = *pcVar5;
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
      if (singleLine_local == true) {
        if ((uint)local_70 == 0) {
          return;
        }
        if (arg == (uint)local_70) {
          return;
        }
        pcVar5 = pcVar5 + ~(ulong)this->originalBegin;
        goto LAB_00293d9b;
      }
      this->sourceBuffer = pcVar5 + 1;
      if (cVar1 == '\r') {
        lVar3 = 1;
        if (pcVar5[1] == '\n') {
          this->sourceBuffer = pcVar5 + 2;
          lVar3 = 2;
        }
        if (encoding == QuotedPrintable) {
          arg = arg + (pcVar5[lVar3 + -1] == '\n') + 1;
        }
      }
      else {
        arg = arg + local_64;
      }
    }
    else {
      if (((((uint)local_70 == 0) && (cVar1 == '`')) && (singleLine_local == false)) &&
         (bVar2 = scanEncodedText::anon_class_16_2_98147aed::operator()(&lookingAtPragma), bVar2)) {
        return;
      }
      if (encoding < 4) {
        (*(code *)(&DAT_004c213c + *(int *)(&DAT_004c213c + (ulong)encoding * 4)))();
        return;
      }
    }
  }
  if (arg == (uint)local_70) {
    return;
  }
  pcVar5 = this->sourceBuffer + ~(ulong)this->originalBegin;
LAB_00293d9b:
  pDVar4 = addDiag(this,(DiagCode)0x160002,(size_t)pcVar5);
  pDVar4 = Diagnostic::operator<<<unsigned_int>(pDVar4,arg);
  Diagnostic::operator<<<unsigned_int>(pDVar4,(uint)local_70);
  return;
}

Assistant:

void Lexer::scanEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                            bool legacyProtectedMode) {
    // Helper function that returns true if the current position in the buffer
    // is looking at the string "pragma".
    auto lookingAtPragma = [&] {
        int index = 0;
        auto endStr = legacyProtectedMode ? "endprotected"sv : "pragma"sv;
        for (char c : endStr) {
            if (peek(++index) != c)
                return false;
        }
        return true;
    };

    auto invalidByte = [&](char invalidChar, std::string_view name) {
        auto& diag = addDiag(diag::InvalidEncodingByte, currentOffset()) << name;
        diag << (isPrintableASCII(invalidChar) ? std::string(1, invalidChar)
                                               : fmt::format("{:#04x}", invalidChar));

        // Try to skip ahead to the next `pragma directive to get us out of this region.
        while (true) {
            char c = peek();
            if (c == '\0' && reallyAtEnd())
                break;

            if (c == '`' && lookingAtPragma())
                break;

            if (singleLine && (c == '\r' || c == '\n'))
                break;

            advance();
        }
    };

    uint32_t byteCount = 0;
    while (true) {
        if (expectedBytes && byteCount >= expectedBytes && !singleLine) {
            if (byteCount != expectedBytes) {
                addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                    << byteCount << expectedBytes;
            }
            return;
        }

        char c = peek();
        if (c == '\r' || c == '\n') {
            // If this is a single line region then we're done here.
            if (singleLine) {
                if (expectedBytes && byteCount != expectedBytes) {
                    addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                        << byteCount << expectedBytes;
                }
                return;
            }

            // Otherwise continue on. This newline doesn't count toward our expected byte limit,
            // unless this is the quoted printable encoding.
            advance();
            if (c == '\r' && peek() == '\n')
                advance();

            if (encoding == ProtectEncoding::QuotedPrintable) {
                byteCount++;
                if (c == '\r' && peek(-1) == '\n')
                    byteCount++;
            }

            continue;
        }

        if (!expectedBytes && !singleLine && c == '`') {
            // Encoding tools probably shouldn't do this but if they do we
            // should try to gracefully guess the end of the region by looking
            // for another non-encoded pragma that ends it.
            if (lookingAtPragma())
                return;
        }

        switch (encoding) {
            case ProtectEncoding::UUEncode: {
                // uuencode tells us the length of the line up front, so use that
                // to read the whole line in one go. The encoding is invalid if that
                // doesn't match up with what we find in the data.
                if (c == '`') {
                    // The grave character is a special case meaning 0 characters on this line.
                    advance();
                    continue;
                }

                if (c < 0x20 || c > 0x20 + 45) {
                    invalidByte(c, "uuencode"sv);
                    return;
                }

                uint32_t count = uint32_t(c - 0x20);
                byteCount += count;
                advance();

                uint32_t encodedCount = (uint32_t)ceil(count * 4 / 3.0);
                for (uint32_t i = 0; i < encodedCount; i++) {
                    c = peek();
                    if (c < 0x20 || c > 0x60) {
                        invalidByte(c, "uuencode"sv);
                        return;
                    }
                    advance();
                }
                break;
            }
            case ProtectEncoding::Base64:
                byteCount += 3;
                for (int i = 0; i < 4; i++) {
                    c = peek();
                    if (i > 1 && c == '=') {
                        byteCount--;
                    }
                    else if (!isBase64Char(c)) {
                        invalidByte(c, "base64"sv);
                        return;
                    }

                    advance();
                }
                break;
            case ProtectEncoding::QuotedPrintable:
                if (!isPrintableASCII(c) && c != '\t') {
                    invalidByte(c, "quoted-printable"sv);
                    return;
                }

                advance();
                if (c == '=') {
                    // If this is a soft line break then it doesn't count
                    // towards our byte count. Otherwise this is an escaped
                    // character that does count.
                    c = peek();
                    if (c == '\r' || c == '\n') {
                        advance();
                        if (c == '\r' && peek() == '\n')
                            advance();
                        continue;
                    }

                    if (!isHexDigit(c) || !isHexDigit(peek(1))) {
                        invalidByte(c, "quoted-printable"sv);
                        return;
                    }

                    advance(2);
                }
                byteCount++;
                break;
            case ProtectEncoding::Raw:
                if (c == '\0' && reallyAtEnd()) {
                    addDiag(diag::RawProtectEOF, currentOffset() - 1);
                    return;
                }

                advance();
                byteCount++;
                break;
        }
    }
}